

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

uint32_t crc32_16bytes(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  byte *local_58;
  uint8_t *currentChar;
  uint32_t four;
  uint32_t three;
  uint32_t two;
  uint32_t one;
  size_t unrolling;
  size_t BytesAtOnce;
  size_t Unroll;
  uint32_t *current;
  uint32_t crc;
  uint32_t previousCrc32_local;
  size_t length_local;
  void *data_local;
  
  current._0_4_ = previousCrc32 ^ 0xffffffff;
  Unroll = (size_t)data;
  for (_crc = length; 0x3f < _crc; _crc = _crc - 0x40) {
    for (_two = 0; _two < 4; _two = _two + 1) {
      uVar4 = *(uint *)Unroll ^ (uint)current;
      uVar1 = *(uint *)(Unroll + 4);
      puVar5 = (uint *)(Unroll + 0xc);
      uVar2 = *(uint *)(Unroll + 8);
      Unroll = Unroll + 0x10;
      uVar3 = *puVar5;
      current._0_4_ =
           Crc32Lookup[0][uVar3 >> 0x18] ^ Crc32Lookup[1][uVar3 >> 0x10 & 0xff] ^
           Crc32Lookup[2][uVar3 >> 8 & 0xff] ^ Crc32Lookup[3][uVar3 & 0xff] ^
           Crc32Lookup[4][uVar2 >> 0x18] ^ Crc32Lookup[5][uVar2 >> 0x10 & 0xff] ^
           Crc32Lookup[6][uVar2 >> 8 & 0xff] ^ Crc32Lookup[7][uVar2 & 0xff] ^
           Crc32Lookup[8][uVar1 >> 0x18] ^ Crc32Lookup[9][uVar1 >> 0x10 & 0xff] ^
           Crc32Lookup[10][uVar1 >> 8 & 0xff] ^ Crc32Lookup[0xb][uVar1 & 0xff] ^
           Crc32Lookup[0xc][uVar4 >> 0x18] ^ Crc32Lookup[0xd][uVar4 >> 0x10 & 0xff] ^
           Crc32Lookup[0xe][uVar4 >> 8 & 0xff] ^ Crc32Lookup[0xf][uVar4 & 0xff];
    }
  }
  local_58 = (byte *)Unroll;
  while (_crc != 0) {
    current._0_4_ = (uint)current >> 8 ^ Crc32Lookup[0][(uint)current & 0xff ^ (uint)*local_58];
    local_58 = local_58 + 1;
    _crc = _crc - 1;
  }
  return (uint)current ^ 0xffffffff;
}

Assistant:

uint32_t crc32_16bytes(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // enabling optimization (at least -O2) automatically unrolls the inner for-loop
  const size_t Unroll = 4;
  const size_t BytesAtOnce = 16 * Unroll;

  while (length >= BytesAtOnce)
  {
    for (size_t unrolling = 0; unrolling < Unroll; unrolling++)
    {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one   = *current++ ^ swap(crc);
    uint32_t two   = *current++;
    uint32_t three = *current++;
    uint32_t four  = *current++;
    crc  = Crc32Lookup[ 0][ four         & 0xFF] ^
           Crc32Lookup[ 1][(four  >>  8) & 0xFF] ^
           Crc32Lookup[ 2][(four  >> 16) & 0xFF] ^
           Crc32Lookup[ 3][(four  >> 24) & 0xFF] ^
           Crc32Lookup[ 4][ three        & 0xFF] ^
           Crc32Lookup[ 5][(three >>  8) & 0xFF] ^
           Crc32Lookup[ 6][(three >> 16) & 0xFF] ^
           Crc32Lookup[ 7][(three >> 24) & 0xFF] ^
           Crc32Lookup[ 8][ two          & 0xFF] ^
           Crc32Lookup[ 9][(two   >>  8) & 0xFF] ^
           Crc32Lookup[10][(two   >> 16) & 0xFF] ^
           Crc32Lookup[11][(two   >> 24) & 0xFF] ^
           Crc32Lookup[12][ one          & 0xFF] ^
           Crc32Lookup[13][(one   >>  8) & 0xFF] ^
           Crc32Lookup[14][(one   >> 16) & 0xFF] ^
           Crc32Lookup[15][(one   >> 24) & 0xFF];
#else
    uint32_t one   = *current++ ^ crc;
    uint32_t two   = *current++;
    uint32_t three = *current++;
    uint32_t four  = *current++;
    crc  = Crc32Lookup[ 0][(four  >> 24) & 0xFF] ^
           Crc32Lookup[ 1][(four  >> 16) & 0xFF] ^
           Crc32Lookup[ 2][(four  >>  8) & 0xFF] ^
           Crc32Lookup[ 3][ four         & 0xFF] ^
           Crc32Lookup[ 4][(three >> 24) & 0xFF] ^
           Crc32Lookup[ 5][(three >> 16) & 0xFF] ^
           Crc32Lookup[ 6][(three >>  8) & 0xFF] ^
           Crc32Lookup[ 7][ three        & 0xFF] ^
           Crc32Lookup[ 8][(two   >> 24) & 0xFF] ^
           Crc32Lookup[ 9][(two   >> 16) & 0xFF] ^
           Crc32Lookup[10][(two   >>  8) & 0xFF] ^
           Crc32Lookup[11][ two          & 0xFF] ^
           Crc32Lookup[12][(one   >> 24) & 0xFF] ^
           Crc32Lookup[13][(one   >> 16) & 0xFF] ^
           Crc32Lookup[14][(one   >>  8) & 0xFF] ^
           Crc32Lookup[15][ one          & 0xFF];
#endif
    }

    length -= BytesAtOnce;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 63 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}